

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_true>::rd_string
          (uintwide_t<32U,_unsigned_int,_void,_true> *this,char *str_input,unsigned_fast_type count,
          int base_hint)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t uc_oct;
  byte bVar7;
  bool bVar8;
  
  cVar4 = (char)base_hint;
  (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
  if (count == 0xffffffffffffffff) {
    if (*str_input == '\0') {
      return true;
    }
    uVar5 = 0;
    do {
      count = uVar5 + 1;
      lVar2 = uVar5 + 1;
      uVar5 = count;
    } while (str_input[lVar2] != '\0');
  }
  if (count == 0) {
    if (cVar4 == '\0') {
      cVar4 = '\n';
    }
    bVar8 = false;
    count = 0;
    uVar5 = 0;
  }
  else {
    bVar8 = *str_input == '-';
    uVar5 = (ulong)(*str_input == '+' || bVar8);
    if (cVar4 == '\0') {
      cVar4 = '\n';
      if (uVar5 < count) {
        if (str_input[uVar5] == '0') {
          if ((byte)(str_input[uVar5 + 1] - 0x30U) < 9) {
            uVar5 = uVar5 + 1;
            cVar4 = '\b';
          }
          else if ((byte)(str_input[uVar5 + 1] | 0x20U) == 0x78) {
            uVar5 = uVar5 | 2;
            cVar4 = '\x10';
          }
        }
      }
      else {
        count = 1;
        uVar5 = 1;
      }
    }
  }
  if (uVar5 < count) {
    uVar6 = 0;
    do {
      bVar1 = str_input[uVar5];
      bVar3 = true;
      if (bVar1 != 0x27) {
        if (cVar4 == '\x10') {
          bVar7 = bVar1 - 0x30;
          bVar3 = (bVar7 < 10 || (byte)(bVar1 + 0xbf) < 6) || (byte)(bVar1 + 0x9f) < 6;
          if ((9 < bVar7) &&
             ((0x25 < bVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)))
             ) goto LAB_0013b079;
          if ((byte)(bVar1 + 0x9f) < 6) {
            bVar7 = bVar1 + 0xa9;
          }
          else if ((byte)(bVar1 + 0xbf) < 6) {
            bVar7 = bVar1 - 0x37;
          }
          else if (9 < bVar7) {
            bVar7 = 0;
          }
          uVar6 = (uint)bVar7 | uVar6 << 4;
        }
        else {
          if (cVar4 == '\n') {
            if (9 < (byte)(bVar1 - 0x30)) {
LAB_0013b0a6:
              bVar3 = false;
              goto LAB_0013b090;
            }
            uVar6 = (uint)(byte)(bVar1 - 0x30) + uVar6 * 10;
          }
          else {
            if (cVar4 != '\b') goto LAB_0013b079;
            if (8 < (byte)(bVar1 - 0x30)) goto LAB_0013b0a6;
            uVar6 = (uint)(byte)(bVar1 - 0x30) | uVar6 << 3;
          }
          bVar3 = true;
        }
        (this->values).super_array<unsigned_int,_1UL>.elems[0] = uVar6;
      }
LAB_0013b079:
      if ((count <= uVar5 + 1) || (uVar5 = uVar5 + 1, bVar3 == false)) goto LAB_0013b090;
    } while( true );
  }
  bVar3 = true;
  uVar6 = 0;
LAB_0013b090:
  if (bVar8) {
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = -uVar6;
  }
  return bVar3;
}

Assistant:

constexpr auto fill_unsafe(DestinationIterator first, DestinationIterator last, ValueType val) -> void
  {
    while(first != last)
    {
      using local_destination_value_type = typename iterator_detail::iterator_traits<DestinationIterator>::value_type;

      *first = static_cast<local_destination_value_type>(val);

      ++first;
    }
  }